

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_set.hpp
# Opt level: O2

void __thiscall
duckdb::FunctionSet<duckdb::TableFunction>::~FunctionSet(FunctionSet<duckdb::TableFunction> *this)

{
  ::std::vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>::~vector
            (&(this->functions).
              super_vector<duckdb::TableFunction,_std::allocator<duckdb::TableFunction>_>);
  ::std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

explicit FunctionSet(string name) : name(std::move(name)) {
	}